

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_var_this(JSContext *ctx,JSFunctionDef *fd)

{
  int iVar1;
  JSFunctionDef *in_RSI;
  JSContext *in_RDI;
  JSVarDef *vd;
  int idx;
  JSAtom in_stack_ffffffffffffffec;
  
  iVar1 = add_var(in_RDI,in_RSI,in_stack_ffffffffffffffec);
  if ((-1 < iVar1) && (in_RSI->is_derived_class_constructor != 0)) {
    *(uint *)&in_RSI->vars[iVar1].field_0xc =
         *(uint *)&in_RSI->vars[iVar1].field_0xc & 0xfffffffd | 2;
  }
  return iVar1;
}

Assistant:

static int add_var_this(JSContext *ctx, JSFunctionDef *fd)
{
    int idx;
    idx = add_var(ctx, fd, JS_ATOM_this);
    if (idx >= 0 && fd->is_derived_class_constructor) {
        JSVarDef *vd = &fd->vars[idx];
        /* XXX: should have is_this flag or var type */
        vd->is_lexical = 1; /* used to trigger 'uninitialized' checks
                               in a derived class constructor */
    }
    return idx;
}